

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

void __thiscall duckdb::TransactionInfo::Serialize(TransactionInfo *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"info_type");
  Serializer::WriteValue<duckdb::ParseInfoType>(serializer,(this->super_ParseInfo).info_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"type");
  Serializer::WriteValue<duckdb::TransactionType>(serializer,(this->super_ParseInfo).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"modifier");
  Serializer::WriteValue<duckdb::TransactionModifierType>
            (serializer,(this->super_ParseInfo).field_0xa);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void TransactionInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<TransactionType>(200, "type", type);
	serializer.WriteProperty<TransactionModifierType>(201, "modifier", modifier);
}